

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O0

int asn1_i2d_ex_primitive
              (ASN1_VALUE **pval,uchar **out,ASN1_ITEM *it,int tag,int aclass,int optional)

{
  int length;
  int iVar1;
  bool bVar2;
  int len2;
  int usetag;
  int len;
  int utype;
  int omit;
  int optional_local;
  int aclass_local;
  int tag_local;
  ASN1_ITEM *it_local;
  uchar **out_local;
  ASN1_VALUE **pval_local;
  
  usetag = it->utype;
  utype = optional;
  omit = aclass;
  optional_local = tag;
  _aclass_local = it;
  it_local = (ASN1_ITEM *)out;
  out_local = (uchar **)pval;
  length = asn1_ex_i2c(pval,(uchar *)0x0,&len,&usetag,it);
  if (length < 0) {
    pval_local._4_4_ = -1;
  }
  else if (len == 0) {
    bVar2 = false;
    if ((usetag != 0x10) && (bVar2 = false, usetag != 0x11)) {
      bVar2 = usetag != -3;
    }
    if (optional_local == -1) {
      optional_local = usetag;
    }
    if (it_local != (ASN1_ITEM *)0x0) {
      if (bVar2) {
        ASN1_put_object((uchar **)it_local,0,length,optional_local,omit);
      }
      iVar1 = asn1_ex_i2c((ASN1_VALUE **)out_local,*(uchar **)it_local,&len,&usetag,_aclass_local);
      if (iVar1 < 0) {
        return -1;
      }
      if (length != iVar1) {
        __assert_fail("len == len2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x1ed,
                      "int asn1_i2d_ex_primitive(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                     );
      }
      if (len != 0) {
        __assert_fail("!omit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                      ,0x1ee,
                      "int asn1_i2d_ex_primitive(ASN1_VALUE **, unsigned char **, const ASN1_ITEM *, int, int, int)"
                     );
      }
      *(long *)it_local = *(long *)it_local + (long)length;
    }
    pval_local._4_4_ = length;
    if (bVar2) {
      pval_local._4_4_ = ASN1_object_size(0,length,optional_local);
    }
  }
  else if (utype == 0) {
    ERR_put_error(0xc,0,0x9b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_enc.cc"
                  ,0x1d5);
    pval_local._4_4_ = -1;
  }
  else {
    pval_local._4_4_ = 0;
  }
  return pval_local._4_4_;
}

Assistant:

static int asn1_i2d_ex_primitive(ASN1_VALUE **pval, unsigned char **out,
                                 const ASN1_ITEM *it, int tag, int aclass,
                                 int optional) {
  // Get length of content octets and maybe find out the underlying type.
  int omit;
  int utype = it->utype;
  int len = asn1_ex_i2c(pval, NULL, &omit, &utype, it);
  if (len < 0) {
    return -1;
  }
  if (omit) {
    if (optional) {
      return 0;
    }
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_MISSING_VALUE);
    return -1;
  }

  // If SEQUENCE, SET or OTHER then header is included in pseudo content
  // octets so don't include tag+length. We need to check here because the
  // call to asn1_ex_i2c() could change utype.
  int usetag =
      utype != V_ASN1_SEQUENCE && utype != V_ASN1_SET && utype != V_ASN1_OTHER;

  // If not implicitly tagged get tag from underlying type
  if (tag == -1) {
    tag = utype;
  }

  // Output tag+length followed by content octets
  if (out) {
    if (usetag) {
      ASN1_put_object(out, /*constructed=*/0, len, tag, aclass);
    }
    int len2 = asn1_ex_i2c(pval, *out, &omit, &utype, it);
    if (len2 < 0) {
      return -1;
    }
    assert(len == len2);
    assert(!omit);
    *out += len;
  }

  if (usetag) {
    return ASN1_object_size(/*constructed=*/0, len, tag);
  }
  return len;
}